

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zello_log.h
# Opt level: O0

string * to_string_abi_cxx11_(ze_device_properties_t val)

{
  ostream *poVar1;
  string *in_RDI;
  ze_device_uuid_t val_00;
  string local_430 [32];
  __cxx11 local_410 [32];
  __cxx11 local_3f0 [32];
  __cxx11 local_3d0 [32];
  __cxx11 local_3b0 [32];
  __cxx11 local_390 [32];
  __cxx11 local_370 [32];
  __cxx11 local_350 [32];
  __cxx11 local_330 [32];
  __cxx11 local_310 [32];
  __cxx11 local_2f0 [32];
  __cxx11 local_2d0 [32];
  __cxx11 local_2b0 [32];
  __cxx11 local_290 [32];
  string local_270 [32];
  __cxx11 local_250 [32];
  __cxx11 local_230 [32];
  string local_210 [32];
  string local_1f0 [32];
  stringstream local_1d0 [8];
  stringstream ss;
  ostream local_1c0 [376];
  string local_48 [55];
  undefined1 local_11;
  string *str;
  
  local_11 = 0;
  std::__cxx11::string::string(in_RDI);
  std::__cxx11::string::operator+=(in_RDI,"Device::properties_t::stype : ");
  to_string_abi_cxx11_((ze_structure_type_t)local_48);
  std::__cxx11::string::operator+=(in_RDI,local_48);
  std::__cxx11::string::~string(local_48);
  std::__cxx11::string::operator+=(in_RDI,"\n");
  std::__cxx11::string::operator+=(in_RDI,"Device::properties_t::pNext : ");
  std::__cxx11::stringstream::stringstream(local_1d0);
  poVar1 = std::operator<<(local_1c0,"0x");
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,std::hex);
  std::ostream::operator<<(poVar1,val._0_8_);
  std::__cxx11::stringstream::str();
  std::__cxx11::string::operator+=(in_RDI,local_1f0);
  std::__cxx11::string::~string(local_1f0);
  std::__cxx11::stringstream::~stringstream(local_1d0);
  std::__cxx11::string::operator+=(in_RDI,"\n");
  std::__cxx11::string::operator+=(in_RDI,"Device::properties_t::type : ");
  to_string_abi_cxx11_((ze_device_type_t)local_210);
  std::__cxx11::string::operator+=(in_RDI,local_210);
  std::__cxx11::string::~string(local_210);
  std::__cxx11::string::operator+=(in_RDI,"\n");
  std::__cxx11::string::operator+=(in_RDI,"Device::properties_t::vendorId : ");
  std::__cxx11::to_string(local_230,val.pNext._4_4_);
  std::__cxx11::string::operator+=(in_RDI,(string *)local_230);
  std::__cxx11::string::~string((string *)local_230);
  std::__cxx11::string::operator+=(in_RDI,"\n");
  std::__cxx11::string::operator+=(in_RDI,"Device::properties_t::deviceId : ");
  std::__cxx11::to_string(local_250,val.type);
  std::__cxx11::string::operator+=(in_RDI,(string *)local_250);
  std::__cxx11::string::~string((string *)local_250);
  std::__cxx11::string::operator+=(in_RDI,"\n");
  std::__cxx11::string::operator+=(in_RDI,"Device::properties_t::flags : ");
  to_string_abi_cxx11_((ze_device_property_flag_t)local_270);
  std::__cxx11::string::operator+=(in_RDI,local_270);
  std::__cxx11::string::~string(local_270);
  std::__cxx11::string::operator+=(in_RDI,"\n");
  std::__cxx11::string::operator+=(in_RDI,"Device::properties_t::subdeviceId : ");
  std::__cxx11::to_string(local_290,val.deviceId);
  std::__cxx11::string::operator+=(in_RDI,(string *)local_290);
  std::__cxx11::string::~string((string *)local_290);
  std::__cxx11::string::operator+=(in_RDI,"\n");
  std::__cxx11::string::operator+=(in_RDI,"Device::properties_t::coreClockRate : ");
  std::__cxx11::to_string(local_2b0,val.flags);
  std::__cxx11::string::operator+=(in_RDI,(string *)local_2b0);
  std::__cxx11::string::~string((string *)local_2b0);
  std::__cxx11::string::operator+=(in_RDI,"\n");
  std::__cxx11::string::operator+=(in_RDI,"Device::properties_t::maxMemAllocSize : ");
  std::__cxx11::to_string(local_2d0,val._32_8_);
  std::__cxx11::string::operator+=(in_RDI,(string *)local_2d0);
  std::__cxx11::string::~string((string *)local_2d0);
  std::__cxx11::string::operator+=(in_RDI,"\n");
  std::__cxx11::string::operator+=(in_RDI,"Device::properties_t::maxHardwareContexts : ");
  std::__cxx11::to_string(local_2f0,(uint)val.maxMemAllocSize);
  std::__cxx11::string::operator+=(in_RDI,(string *)local_2f0);
  std::__cxx11::string::~string((string *)local_2f0);
  std::__cxx11::string::operator+=(in_RDI,"\n");
  std::__cxx11::string::operator+=(in_RDI,"Device::properties_t::maxCommandQueuePriority : ");
  std::__cxx11::to_string(local_310,val.maxMemAllocSize._4_4_);
  std::__cxx11::string::operator+=(in_RDI,(string *)local_310);
  std::__cxx11::string::~string((string *)local_310);
  std::__cxx11::string::operator+=(in_RDI,"\n");
  std::__cxx11::string::operator+=(in_RDI,"Device::properties_t::numThreadsPerEU : ");
  std::__cxx11::to_string(local_330,val.maxHardwareContexts);
  std::__cxx11::string::operator+=(in_RDI,(string *)local_330);
  std::__cxx11::string::~string((string *)local_330);
  std::__cxx11::string::operator+=(in_RDI,"\n");
  std::__cxx11::string::operator+=(in_RDI,"Device::properties_t::physicalEUSimdWidth : ");
  std::__cxx11::to_string(local_350,val.maxCommandQueuePriority);
  std::__cxx11::string::operator+=(in_RDI,(string *)local_350);
  std::__cxx11::string::~string((string *)local_350);
  std::__cxx11::string::operator+=(in_RDI,"\n");
  std::__cxx11::string::operator+=(in_RDI,"Device::properties_t::numEUsPerSubslice : ");
  std::__cxx11::to_string(local_370,val.numThreadsPerEU);
  std::__cxx11::string::operator+=(in_RDI,(string *)local_370);
  std::__cxx11::string::~string((string *)local_370);
  std::__cxx11::string::operator+=(in_RDI,"\n");
  std::__cxx11::string::operator+=(in_RDI,"Device::properties_t::numSubslicesPerSlice : ");
  std::__cxx11::to_string(local_390,val.physicalEUSimdWidth);
  std::__cxx11::string::operator+=(in_RDI,(string *)local_390);
  std::__cxx11::string::~string((string *)local_390);
  std::__cxx11::string::operator+=(in_RDI,"\n");
  std::__cxx11::string::operator+=(in_RDI,"Device::properties_t::numSlices : ");
  std::__cxx11::to_string(local_3b0,val.numEUsPerSubslice);
  std::__cxx11::string::operator+=(in_RDI,(string *)local_3b0);
  std::__cxx11::string::~string((string *)local_3b0);
  std::__cxx11::string::operator+=(in_RDI,"\n");
  std::__cxx11::string::operator+=(in_RDI,"Device::properties_t::timerResolution : ");
  std::__cxx11::to_string(local_3d0,val._72_8_);
  std::__cxx11::string::operator+=(in_RDI,(string *)local_3d0);
  std::__cxx11::string::~string((string *)local_3d0);
  std::__cxx11::string::operator+=(in_RDI,"\n");
  std::__cxx11::string::operator+=(in_RDI,"Device::properties_t::timestampValidBits : ");
  std::__cxx11::to_string(local_3f0,(uint)val.timerResolution);
  std::__cxx11::string::operator+=(in_RDI,(string *)local_3f0);
  std::__cxx11::string::~string((string *)local_3f0);
  std::__cxx11::string::operator+=(in_RDI,"\n");
  std::__cxx11::string::operator+=(in_RDI,"Device::properties_t::kernelTimestampValidBits : ");
  std::__cxx11::to_string(local_410,val.timerResolution._4_4_);
  std::__cxx11::string::operator+=(in_RDI,(string *)local_410);
  std::__cxx11::string::~string((string *)local_410);
  std::__cxx11::string::operator+=(in_RDI,"\n");
  std::__cxx11::string::operator+=(in_RDI,"Device::properties_t::uuid : ");
  val_00.id._8_8_ = val._88_8_;
  val_00.id._0_8_ = local_430;
  to_string_abi_cxx11_(val_00);
  std::__cxx11::string::operator+=(in_RDI,local_430);
  std::__cxx11::string::~string(local_430);
  std::__cxx11::string::operator+=(in_RDI,"\n");
  std::__cxx11::string::operator+=(in_RDI,"Device::properties_t::name : ");
  std::__cxx11::string::operator+=(in_RDI,(char *)(val.uuid.id + 8));
  std::__cxx11::string::operator+=(in_RDI,"\n");
  return in_RDI;
}

Assistant:

std::string to_string(const ze_device_properties_t val)
{
    std::string str;
    
    str += "Device::properties_t::stype : ";
    str += to_string(val.stype);
    str += "\n";
    
    str += "Device::properties_t::pNext : ";
    {
        std::stringstream ss;
        ss << "0x" << std::hex << reinterpret_cast<size_t>(val.pNext);
        str += ss.str();
    }
    str += "\n";
    
    str += "Device::properties_t::type : ";
    str += to_string(val.type);
    str += "\n";
    
    str += "Device::properties_t::vendorId : ";
    str += std::to_string(val.vendorId);
    str += "\n";
    
    str += "Device::properties_t::deviceId : ";
    str += std::to_string(val.deviceId);
    str += "\n";
    
    str += "Device::properties_t::flags : ";
    str += to_string((ze_device_property_flag_t)val.flags);
    str += "\n";
    
    str += "Device::properties_t::subdeviceId : ";
    str += std::to_string(val.subdeviceId);
    str += "\n";
    
    str += "Device::properties_t::coreClockRate : ";
    str += std::to_string(val.coreClockRate);
    str += "\n";
    
    str += "Device::properties_t::maxMemAllocSize : ";
    str += std::to_string(val.maxMemAllocSize);
    str += "\n";
    
    str += "Device::properties_t::maxHardwareContexts : ";
    str += std::to_string(val.maxHardwareContexts);
    str += "\n";
    
    str += "Device::properties_t::maxCommandQueuePriority : ";
    str += std::to_string(val.maxCommandQueuePriority);
    str += "\n";
    
    str += "Device::properties_t::numThreadsPerEU : ";
    str += std::to_string(val.numThreadsPerEU);
    str += "\n";
    
    str += "Device::properties_t::physicalEUSimdWidth : ";
    str += std::to_string(val.physicalEUSimdWidth);
    str += "\n";
    
    str += "Device::properties_t::numEUsPerSubslice : ";
    str += std::to_string(val.numEUsPerSubslice);
    str += "\n";
    
    str += "Device::properties_t::numSubslicesPerSlice : ";
    str += std::to_string(val.numSubslicesPerSlice);
    str += "\n";
    
    str += "Device::properties_t::numSlices : ";
    str += std::to_string(val.numSlices);
    str += "\n";
    
    str += "Device::properties_t::timerResolution : ";
    str += std::to_string(val.timerResolution);
    str += "\n";
    
    str += "Device::properties_t::timestampValidBits : ";
    str += std::to_string(val.timestampValidBits);
    str += "\n";
    
    str += "Device::properties_t::kernelTimestampValidBits : ";
    str += std::to_string(val.kernelTimestampValidBits);
    str += "\n";
    
    str += "Device::properties_t::uuid : ";
    str += to_string(val.uuid);
    str += "\n";
    
    str += "Device::properties_t::name : ";
    str += val.name;
    str += "\n";

    return str;
}